

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  undefined8 uVar1;
  ulong uVar2;
  string *psVar3;
  MethodOptions *pMVar4;
  undefined8 *puVar5;
  Arena *arena;
  
  uVar1 = *(undefined8 *)(this + 8);
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  uVar2 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  internal::ArenaStringPtr::Set(&proto->name_,uVar1,puVar5);
  internal::LazyDescriptor::Once
            ((LazyDescriptor *)(this + 0x18),*(ServiceDescriptor **)(this + 0x10));
  if ((*(byte *)(*(long *)(this + 0x18) + 1) & 2) == 0) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    uVar2 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
    internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&proto->input_type_,".",puVar5);
  }
  *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
  uVar2 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  psVar3 = internal::ArenaStringPtr::Mutable_abi_cxx11_(&proto->input_type_,puVar5);
  internal::LazyDescriptor::Once
            ((LazyDescriptor *)(this + 0x18),*(ServiceDescriptor **)(this + 0x10));
  std::__cxx11::string::_M_append
            ((char *)psVar3,*(ulong *)(*(long *)(*(long *)(this + 0x18) + 8) + 0x20));
  internal::LazyDescriptor::Once
            ((LazyDescriptor *)(this + 0x28),*(ServiceDescriptor **)(this + 0x10));
  if ((*(byte *)(*(long *)(this + 0x28) + 1) & 2) == 0) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
    uVar2 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
    internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&proto->output_type_,".",puVar5);
  }
  *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
  uVar2 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  psVar3 = internal::ArenaStringPtr::Mutable_abi_cxx11_(&proto->output_type_,puVar5);
  internal::LazyDescriptor::Once
            ((LazyDescriptor *)(this + 0x28),*(ServiceDescriptor **)(this + 0x10));
  std::__cxx11::string::_M_append
            ((char *)psVar3,*(ulong *)(*(long *)(*(long *)(this + 0x28) + 8) + 0x20));
  if (*(undefined1 **)(this + 0x38) != _MethodOptions_default_instance_) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 8;
    if (proto->options_ == (MethodOptions *)0x0) {
      uVar2 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      arena = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      pMVar4 = Arena::CreateMaybeMessage<google::protobuf::MethodOptions>(arena);
      proto->options_ = pMVar4;
    }
    MethodOptions::CopyFrom(proto->options_,*(MethodOptions **)(this + 0x38));
  }
  if (this[1] == (MethodDescriptor)0x1) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x10;
    proto->client_streaming_ = true;
  }
  if (this[2] == (MethodDescriptor)0x1) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x20;
    proto->server_streaming_ = true;
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  proto->mutable_input_type()->append(input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  proto->mutable_output_type()->append(output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }

  if (client_streaming_) {
    proto->set_client_streaming(true);
  }
  if (server_streaming_) {
    proto->set_server_streaming(true);
  }
}